

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O0

ParserResult * Catch::Clara::Detail::convertInto<double>(string *source,double *target)

{
  byte bVar1;
  _Ios_Openmode _Var2;
  double *in_RDX;
  string *in_RSI;
  ParserResult *in_RDI;
  stringstream ss;
  string *in_stack_fffffffffffffdd8;
  undefined7 in_stack_fffffffffffffde0;
  ParserResult *__lhs;
  string local_1f0 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe20;
  char *in_stack_fffffffffffffe28;
  string local_1d0 [48];
  stringstream local_1a0 [392];
  double *local_18;
  
  __lhs = in_RDI;
  local_18 = in_RDX;
  _Var2 = std::operator|(_S_out,_S_in);
  std::__cxx11::stringstream::stringstream(local_1a0,in_RSI,_Var2);
  std::istream::operator>>((istream *)local_1a0,local_18);
  bVar1 = std::ios::fail();
  if ((bVar1 & 1) == 0) {
    BasicResult<Catch::Clara::ParseResultType>::ok<Catch::Clara::ParseResultType>
              ((ParseResultType *)in_stack_fffffffffffffdd8);
  }
  else {
    std::operator+(in_stack_fffffffffffffe28,in_stack_fffffffffffffe20);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                   (char *)CONCAT17(bVar1,in_stack_fffffffffffffde0));
    BasicResult<Catch::Clara::ParseResultType>::runtimeError(in_stack_fffffffffffffdd8);
    std::__cxx11::string::~string(local_1d0);
    std::__cxx11::string::~string(local_1f0);
  }
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return in_RDI;
}

Assistant:

ParserResult convertInto( std::string const& source, T& target ) {
                std::stringstream ss( source );
                ss >> target;
                if ( ss.fail() ) {
                    return ParserResult::runtimeError(
                        "Unable to convert '" + source +
                        "' to destination type" );
                } else {
                    return ParserResult::ok( ParseResultType::Matched );
                }
            }